

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directories.cpp
# Opt level: O0

void directories::MADPCreateResultsDir(string *method,string *problem)

{
  int iVar1;
  char *pcVar2;
  ostream *poVar3;
  E *this;
  stringstream ss;
  stat statInfo;
  string dir;
  stringstream *in_stack_fffffffffffffd08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd18;
  stringstream local_2d8 [16];
  ostream local_2c8 [376];
  stat local_150;
  string local_b0 [32];
  string local_90 [32];
  string local_70 [32];
  string local_50 [32];
  string local_30 [48];
  
  MADPGetResultsDir_abi_cxx11_();
  std::operator+(in_stack_fffffffffffffd18,(char *)in_stack_fffffffffffffd10);
  std::operator+(in_stack_fffffffffffffd18,in_stack_fffffffffffffd10);
  std::operator+(in_stack_fffffffffffffd18,(char *)in_stack_fffffffffffffd10);
  std::operator+(in_stack_fffffffffffffd18,in_stack_fffffffffffffd10);
  std::__cxx11::string::~string(local_50);
  std::__cxx11::string::~string(local_70);
  std::__cxx11::string::~string(local_90);
  std::__cxx11::string::~string(local_b0);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  iVar1 = stat(pcVar2,&local_150);
  if ((iVar1 != 0) || ((local_150.st_mode & 0xf000) != 0x4000)) {
    pcVar2 = (char *)std::__cxx11::string::c_str();
    iVar1 = mkdir(pcVar2,0x1ff);
    if (iVar1 != 0) {
      std::__cxx11::stringstream::stringstream(local_2d8);
      poVar3 = std::operator<<(local_2c8,"mkdir error for ");
      std::operator<<(poVar3,local_30);
      this = (E *)__cxa_allocate_exception(0x28);
      E::E(this,in_stack_fffffffffffffd08);
      __cxa_throw(this,&E::typeinfo,E::~E);
    }
  }
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void directories::MADPCreateResultsDir(const string & method,
                                       const string & problem)
{
    string dir=MADPGetResultsDir() + "/" + method + "/" + problem;
    
    struct stat statInfo;
    if(stat(dir.c_str(),&statInfo)==0 &&
       S_ISDIR(statInfo.st_mode))
    {
#if 0
        cout << "Results dir " << dir << " already exists" << endl;
#endif
    }
    else
        if(mkdir(dir.c_str(),0777)!=0)
        {
            stringstream ss;
            ss << "mkdir error for " << dir;
            throw(E(ss));
        }
}